

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::WBClearObject
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,char *addr)

{
  ushort uVar1;
  char *pcVar2;
  code *pcVar3;
  bool bVar4;
  undefined8 *in_FS_OFFSET;
  uint local_24;
  uint i;
  uint count;
  uint index;
  char *addr_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  if ((int)(((long)addr - (long)(this->super_HeapBlock).address & 0xffffffffU) %
           (ulong)this->objectSize) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.h"
                       ,0x275,"((uint)(addr - this->address) % this->objectSize == 0)",
                       "(uint)(addr - this->address) % this->objectSize == 0");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  pcVar2 = (this->super_HeapBlock).address;
  uVar1 = this->objectSize;
  for (local_24 = 0; local_24 < uVar1 >> 3; local_24 = local_24 + 1) {
    BVStatic<4096UL>::TestAndClearInterlocked
              (&this->wbVerifyBits,((uint)((int)addr - (int)pcVar2) >> 3) + local_24);
  }
  return;
}

Assistant:

virtual void WBClearObject(char* addr) override
    {
        Assert((uint)(addr - this->address) % this->objectSize == 0);
        uint index = (uint)(addr - this->address) / sizeof(void*);
        uint count = (uint)(this->objectSize / sizeof(void*));
        for (uint i = 0; i < count; i++)
        {
            wbVerifyBits.TestAndClearInterlocked(index + i);
        }
    }